

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int countint(TValue *key,int *nums)

{
  int iVar1;
  int k;
  int *nums_local;
  TValue *key_local;
  
  iVar1 = arrayindex(key);
  if ((iVar1 < 1) || (0x40000000 < iVar1)) {
    key_local._4_4_ = 0;
  }
  else {
    iVar1 = luaO_log2(iVar1 - 1);
    nums[iVar1 + 1] = nums[iVar1 + 1] + 1;
    key_local._4_4_ = 1;
  }
  return key_local._4_4_;
}

Assistant:

static int countint(const TValue*key,int*nums){
int k=arrayindex(key);
if(0<k&&k<=(1<<(32-2))){
nums[ceillog2(k)]++;
return 1;
}
else
return 0;
}